

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O0

void test_bson_iter_recurse(void)

{
  byte bVar1;
  int iVar2;
  bson_t cb;
  bson_t b;
  bson_iter_t child;
  bson_iter_t iter;
  undefined1 auStack_280 [128];
  undefined1 local_200 [128];
  undefined1 local_180 [128];
  undefined1 local_100 [248];
  
  bson_init(local_200);
  bson_init(auStack_280);
  bVar1 = bson_append_int32(auStack_280,"0",1,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            500,"test_bson_iter_recurse","bson_append_int32 (&cb, \"0\", 1, 0)");
    abort();
  }
  bVar1 = bson_append_int32(auStack_280,"1",1);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1f5,"test_bson_iter_recurse","bson_append_int32 (&cb, \"1\", 1, 1)");
    abort();
  }
  bVar1 = bson_append_int32(auStack_280,"2",1,2);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1f6,"test_bson_iter_recurse","bson_append_int32 (&cb, \"2\", 1, 2)");
    abort();
  }
  bVar1 = bson_append_array(local_200,"key",0xffffffff,auStack_280);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1f7,"test_bson_iter_recurse","bson_append_array (&b, \"key\", -1, &cb)");
    abort();
  }
  bVar1 = bson_iter_init_find(local_100,local_200,"key");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1f8,"test_bson_iter_recurse","bson_iter_init_find (&iter, &b, \"key\")");
    abort();
  }
  iVar2 = bson_iter_type(local_100);
  if (iVar2 != 4) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1f9,"test_bson_iter_recurse","BSON_ITER_HOLDS_ARRAY (&iter)");
    abort();
  }
  bVar1 = bson_iter_recurse(local_100,local_180);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1fa,"test_bson_iter_recurse","bson_iter_recurse (&iter, &child)");
    abort();
  }
  bVar1 = bson_iter_find(local_180,"0");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1fb,"test_bson_iter_recurse","bson_iter_find (&child, \"0\")");
    abort();
  }
  bVar1 = bson_iter_find(local_180,"1");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1fc,"test_bson_iter_recurse","bson_iter_find (&child, \"1\")");
    abort();
  }
  bVar1 = bson_iter_find(local_180,"2");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1fd,"test_bson_iter_recurse","bson_iter_find (&child, \"2\")");
    abort();
  }
  bVar1 = bson_iter_next(local_180);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1fe,"test_bson_iter_recurse","!bson_iter_next (&child)");
    abort();
  }
  bson_destroy(local_200);
  bson_destroy(auStack_280);
  return;
}

Assistant:

static void
test_bson_iter_recurse (void)
{
   bson_iter_t iter;
   bson_iter_t child;
   bson_t b;
   bson_t cb;

   bson_init (&b);
   bson_init (&cb);
   BSON_ASSERT (bson_append_int32 (&cb, "0", 1, 0));
   BSON_ASSERT (bson_append_int32 (&cb, "1", 1, 1));
   BSON_ASSERT (bson_append_int32 (&cb, "2", 1, 2));
   BSON_ASSERT (bson_append_array (&b, "key", -1, &cb));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_ARRAY (&iter));
   BSON_ASSERT (bson_iter_recurse (&iter, &child));
   BSON_ASSERT (bson_iter_find (&child, "0"));
   BSON_ASSERT (bson_iter_find (&child, "1"));
   BSON_ASSERT (bson_iter_find (&child, "2"));
   BSON_ASSERT (!bson_iter_next (&child));
   bson_destroy (&b);
   bson_destroy (&cb);
}